

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O2

TGAColor __thiscall TGAImage::get(TGAImage *this,size_t x,size_t y)

{
  pointer puVar1;
  TGAColor TVar2;
  undefined8 uVar3;
  undefined8 local_10;
  
  puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    uVar3 = 0;
    if ((x < this->width) && (y < this->height)) {
      TGAColor::TGAColor((TGAColor *)&local_10,puVar1 + (this->width * y + x) * (ulong)this->bytespp
                         ,(uint8_t)this->bytespp);
      uVar3 = local_10;
    }
    return SUB85(uVar3,0);
  }
  TVar2.bgra[0] = '\0';
  TVar2.bgra[1] = '\0';
  TVar2.bgra[2] = '\0';
  TVar2.bgra[3] = '\0';
  TVar2.bytespp = '\0';
  return TVar2;
}

Assistant:

TGAColor TGAImage::get(const size_t x, const size_t y) const
{
    if (!data.size() || x < 0 || y < 0 || x >= width || y >= height) return {};
    return TGAColor(data.data() + (x + y * width) * bytespp, bytespp);
}